

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O1

void __thiscall
DataStream::Xor(DataStream *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *key)

{
  long lVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer puVar4;
  pointer puVar5;
  size_type sVar6;
  long lVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar2 = (this->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
  pbVar3 = (this->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar6 = this->m_read_pos;
  puVar4 = (key->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (key->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pbVar2 + sVar6 != pbVar3 && puVar5 != puVar4) {
    lVar7 = 0;
    do {
      pbVar2[sVar6] = pbVar2[sVar6] ^ puVar4[lVar7];
      lVar7 = lVar7 + 1;
      if (lVar7 == (long)puVar5 - (long)puVar4) {
        lVar7 = 0;
      }
      sVar6 = sVar6 + 1;
    } while ((long)pbVar3 - (long)pbVar2 != sVar6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Xor(const std::vector<unsigned char>& key)
    {
        util::Xor(MakeWritableByteSpan(*this), MakeByteSpan(key));
    }